

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O2

adt_error_t adt_ary_extend(adt_ary_t *self,int32_t s32Len)

{
  uint uVar1;
  void **__ptr;
  void **__dest;
  
  if (self == (adt_ary_t *)0x0) {
    return '\x01';
  }
  uVar1 = self->s32CurLen;
  if ((int)uVar1 < s32Len) {
    if (self->s32AllocLen < s32Len) {
      if (s32Len == 0x7fffffff) {
        return '\x04';
      }
      __dest = (void **)malloc((ulong)(uint)s32Len << 3);
      if (__dest == (void **)0x0) {
        return '\x02';
      }
      __ptr = self->ppAlloc;
      if (__ptr != (void **)0x0) {
        memset(__dest + (int)uVar1,0,(long)(int)(s32Len - uVar1) << 3);
        memcpy(__dest,self->pFirst,(ulong)uVar1 << 3);
        free(__ptr);
      }
      self->pFirst = __dest;
      self->ppAlloc = __dest;
      self->s32CurLen = s32Len;
      self->s32AllocLen = s32Len;
    }
    else {
      memmove(self->ppAlloc,self->pFirst,(ulong)uVar1 << 3);
      self->pFirst = self->ppAlloc;
      self->s32CurLen = s32Len;
    }
  }
  return '\0';
}

Assistant:

adt_error_t	adt_ary_extend(adt_ary_t *self, int32_t s32Len){
   if (self != 0) {
      void **ppAlloc;
      //check if current length is greater than requested length
      if( self->s32CurLen>=s32Len ) return ADT_NO_ERROR;

      //check if allocated length is greater than requested length
      if( (self->s32AllocLen>=s32Len) ){
         //shift array data to start of allocated array
         memmove(self->ppAlloc,self->pFirst,((unsigned int)self->s32CurLen) * sizeof(void*));
         self->pFirst = self->ppAlloc;
         self->s32CurLen = s32Len;
      }
      else {
         //need to allocate new array data element and copy data to newly allocated memory
         if(s32Len>= INT32_MAX){
            return ADT_LENGTH_ERROR;
         }
         ppAlloc = (void**) malloc(ELEM_SIZE*((unsigned int)s32Len));
         if (ppAlloc == 0)
         {
            return ADT_MEM_ERROR;
         }
         if(self->ppAlloc){
            size_t numNewElems = (size_t) (s32Len - self->s32CurLen);
            memset(ppAlloc+self->s32CurLen, 0,  numNewElems * ELEM_SIZE);
            memcpy(ppAlloc,self->pFirst, ((unsigned int)self->s32CurLen) * ELEM_SIZE);
            free(self->ppAlloc);
         }
         self->ppAlloc = self->pFirst = ppAlloc;
         self->s32AllocLen = self->s32CurLen = s32Len;
      }
      return ADT_NO_ERROR;
   }
	return ADT_INVALID_ARGUMENT_ERROR;
}